

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t exr_attr_set_v3d(exr_context_t ctxt,int part_index,char *name,exr_attr_v3d_t *val)

{
  pthread_mutex_t *__mutex;
  exr_attr_m33d_t *peVar1;
  double dVar2;
  exr_result_t eVar3;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  char *pcVar4;
  exr_context_t nonc;
  char *pcVar5;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_38;
  
  local_38 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar3 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar3;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar3 = 0x15;
LAB_00124bad:
    eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar3);
    return eVar3;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eVar3 = 8;
    goto LAB_00124bad;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar3 = exr_attr_list_find_by_name(ctxt,list,name,&local_38);
  if (eVar3 == 0) {
    if (local_38->type != EXR_ATTR_V3D) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar5 = local_38->type_name;
      pcVar4 = "\'%s\' requested type \'v3d\', but stored attributes is type \'%s\'";
      eVar3 = 0x10;
      goto LAB_00124ca5;
    }
    if (val == (exr_attr_v3d_t *)0x0) goto LAB_00124c87;
  }
  else {
    if (eVar3 != 0xf) goto LAB_00124c58;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar3 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_V3D,0,(uint8_t **)0x0,&local_38);
    if (val == (exr_attr_v3d_t *)0x0) {
LAB_00124c87:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar4 = "No input value for setting \'%s\', type \'%s\'";
      pcVar5 = "v3d";
      eVar3 = 3;
LAB_00124ca5:
      eVar3 = (*ctxt->print_error)(ctxt,eVar3,pcVar4,name,pcVar5);
      return eVar3;
    }
    if (eVar3 != 0) goto LAB_00124c58;
  }
  peVar1 = (local_38->field_6).m33d;
  peVar1->m[2] = val->z;
  dVar2 = val->y;
  peVar1->m[0] = val->x;
  peVar1->m[1] = dVar2;
  eVar3 = 0;
LAB_00124c58:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_set_v3d (
    exr_context_t         ctxt,
    int                   part_index,
    const char*           name,
    const exr_attr_v3d_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_V3D, v3d);
}